

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigUInt32::read
          (PLYValueBigUInt32 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = std::streambuf::sbumpc();
  this->value = iVar1 << 0x18;
  uVar2 = std::streambuf::sbumpc();
  this->value = (uVar2 & 0xff) << 0x10 | this->value;
  uVar2 = std::streambuf::sbumpc();
  this->value = (uVar2 & 0xff) << 8 | this->value;
  uVar2 = std::streambuf::sbumpc();
  this->value = uVar2 & 0xff | this->value;
  return (ssize_t)this;
}

Assistant:

void read(std::streambuf *in)
    {
      value=(in->sbumpc()&0xff)<<24;
      value|=(in->sbumpc()&0xff)<<16;
      value|=(in->sbumpc()&0xff)<<8;
      value|=in->sbumpc()&0xff;
    }